

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateFastInlineStringSplitMatch(Lowerer *this,Instr *instr)

{
  undefined2 valueType;
  Opnd *newDst;
  Opnd *this_00;
  Opnd *this_01;
  _func_int **pp_Var1;
  Instr *argoutInlineSpecialized;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  int iVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  LabelInstr *labelHelper;
  LowererMD *pLVar9;
  undefined4 extraout_var;
  AddrOpnd *compareSrc2;
  Lowerer *pLVar10;
  IndirOpnd *compareSrc1;
  Instr *this_02;
  BailOutInfo *bailoutInfo;
  IntConstOpnd *opndArg;
  RegOpnd *dstOpnd;
  LabelInstr *target;
  JnHelperMethod helperMethod;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseStackAllocationOpnd;
  LowererMD *local_58;
  Opnd *argsOpnd [2];
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x501e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar4) goto LAB_005a835c;
    *puVar8 = 0;
  }
  newDst = instr->m_dst;
  this_00 = instr->m_src1;
  this_01 = instr->m_src2;
  OVar5 = IR::Opnd::GetKind(this_01);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a835c;
    *puVar8 = 0;
  }
  pp_Var1 = this_01[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a835c;
    *puVar8 = 0;
  }
  argoutInlineSpecialized = (Instr *)pp_Var1[5];
  bVar4 = IR::Instr::FetchOperands(instr,(Opnd **)&local_58,2);
  if (bVar4) {
    local_80._0_2_ = ((ValueType *)&local_58->m_func)->field_0;
    bVar4 = ValueType::IsLikelyString((ValueType *)local_80);
    if (!bVar4) {
      return;
    }
    bVar4 = IR::Opnd::IsTaggedInt(argsOpnd[0]);
    if (bVar4) {
      return;
    }
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    pLVar10 = (Lowerer *)local_80;
    local_80._0_2_ = (((ValueType *)&local_58->m_func)->field_0).bits;
    bVar4 = ValueType::IsString((ValueType *)pLVar10);
    if (!bVar4) {
      pLVar9 = (LowererMD *)GetRegOpnd(pLVar10,(Opnd *)local_58,instr,this->m_func,TyVar);
      local_58 = pLVar9;
      OVar5 = IR::Opnd::GetKind((Opnd *)pLVar9);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a835c;
        *puVar8 = 0;
      }
      GenerateStringTest(this,(RegOpnd *)pLVar9,instr,labelHelper,(LabelInstr *)0x0,true);
    }
    bVar4 = IR::Opnd::IsNotTaggedValue(argsOpnd[0]);
    if (!bVar4) {
      LowererMD::GenerateObjectTest(&this->m_lowererMD,argsOpnd[0],instr,labelHelper,false);
    }
    pSVar2 = instr->m_func->m_scriptContextInfo;
    iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x23);
    pLVar10 = (Lowerer *)CONCAT44(extraout_var,iVar6);
    compareSrc2 = IR::AddrOpnd::New(pLVar10,AddrOpndKindDynamicVtable,this->m_func,false,(Var)0x0);
    pLVar10 = (Lowerer *)GetRegOpnd(pLVar10,argsOpnd[0],instr,this->m_func,TyVar);
    argsOpnd[0] = (Opnd *)pLVar10;
    OVar5 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005a835c;
      *puVar8 = 0;
    }
    compareSrc1 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,instr->m_func,false);
    InsertCompareBranch(pLVar10,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,false,
                        labelHelper,instr,false);
    this_02 = IR::Instr::New(CALL,instr->m_func);
    if (newDst != (Opnd *)0x0) {
      IR::Instr::SetDst(this_02,newDst);
    }
    IR::Instr::InsertBefore(instr,this_02);
    if (((instr->field_0x38 & 0x10) != 0) &&
       (BVar7 = IR::Instr::GetBailOutKind(instr),
       (BVar7 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) {
      bailoutInfo = IR::Instr::GetBailOutInfo(instr);
      BVar7 = IR::Instr::GetBailOutKind(instr);
      this_02 = AddBailoutToHelperCallInstr(this,this_02,bailoutInfo,BVar7,instr);
    }
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindHelperCall) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
      if (!bVar4) goto LAB_005a835c;
      *puVar8 = 0;
    }
    if (*(int *)&this_00[1]._vptr_Opnd == 0x1ad) {
      opndArg = IR::IntConstOpnd::New(0xffffffff,TyUint32,instr->m_func,false);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,this_02,&opndArg->super_Opnd);
    }
    pLVar9 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(pLVar9,this_02,(Opnd *)local_58);
    autoReuseStackAllocationOpnd._16_8_ = pLVar9;
    LowererMD::LoadHelperArgument(pLVar9,this_02,argsOpnd[0]);
    LoadScriptContext(this,this_02);
    local_80 = (undefined1  [8])0x0;
    autoReuseStackAllocationOpnd.func._1_1_ = 1;
    if ((newDst == (Opnd *)0x0) || ((instr->field_0x36 & 8) == 0)) {
      OVar5 = IR::Opnd::GetKind(this_00);
      if (OVar5 != OpndKindHelperCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
        if (!bVar4) goto LAB_005a835c;
        *puVar8 = 0;
      }
      if (*(int *)&this_00[1]._vptr_Opnd == 0x1a9) {
        helperMethod = (uint)(newDst == (Opnd *)0x0) * 2 + HelperRegExp_MatchResultUsed;
      }
      else if (*(int *)&this_00[1]._vptr_Opnd == 0x1ad) {
        helperMethod = (uint)(newDst == (Opnd *)0x0) * 2 + HelperRegExp_SplitResultUsed;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x5093,"(false)","false");
        if (!bVar4) goto LAB_005a835c;
        *puVar8 = 0;
        helperMethod = HelperInvalid;
      }
    }
    else {
      OVar5 = IR::Opnd::GetKind(this_00);
      if (OVar5 != OpndKindHelperCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
        if (!bVar4) goto LAB_005a835c;
        *puVar8 = 0;
      }
      if (*(int *)&this_00[1]._vptr_Opnd == 0x1a9) {
        helperMethod = HelperRegExp_MatchResultUsedAndMayBeTemp;
      }
      else {
        helperMethod = HelperRegExp_SplitResultUsedAndMayBeTemp;
        if (*(int *)&this_00[1]._vptr_Opnd != 0x1ad) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x5075,"(false)","false");
          if (!bVar4) {
LAB_005a835c:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
          helperMethod = HelperInvalid;
        }
      }
      dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)local_80,&dstOpnd->super_Opnd,this->m_func,true);
      valueType = newDst->m_valueType;
      IR::Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)valueType);
      GenerateMarkTempAlloc(this,dstOpnd,Js::JavascriptArray::StackAllocationSize,this_02);
      LowererMD::LoadHelperArgument
                ((LowererMD *)autoReuseStackAllocationOpnd._16_8_,this_02,&dstOpnd->super_Opnd);
    }
    LowererMD::ChangeToHelperCall
              ((LowererMD *)autoReuseStackAllocationOpnd._16_8_,this_02,helperMethod,
               (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
    pLVar10 = (Lowerer *)0x9;
    InsertBranch(Br,true,target,&labelHelper->super_Instr);
    RelocateCallDirectToHelperPath(pLVar10,argoutInlineSpecialized,labelHelper);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineStringSplitMatch(IR::Instr * instr)
{
    // a.split(b,c (optional) )
    // We want to emit the fast path when
    //     1. c is not present, and
    //     2. 'a' is a string and 'b' is a regex.
    //
    // a.match(b)
    // We want to emit the fast path when 'a' is a string and 'b' is a regex.

    Assert(instr->m_opcode == Js::OpCode::CallDirect);
    IR::Opnd * callDst = instr->GetDst();

    //helperCallOpnd
    IR::Opnd * src1 = instr->GetSrc1();

    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = instr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2];
    if(!instr->FetchOperands(argsOpnd, 2))
    {
        return;
    }

    if(!argsOpnd[0]->GetValueType().IsLikelyString() || argsOpnd[1]->IsTaggedInt())
    {
        return;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if(!argsOpnd[0]->GetValueType().IsString())
    {
        argsOpnd[0] = GetRegOpnd(argsOpnd[0], instr, m_func, TyVar);
        this->GenerateStringTest(argsOpnd[0]->AsRegOpnd(), instr, labelHelper);
    }

    if(!argsOpnd[1]->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(argsOpnd[1], instr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    argsOpnd[1] = GetRegOpnd(argsOpnd[1], instr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(argsOpnd[1]->AsRegOpnd(), 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        instr);

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    instr->InsertBefore(helperCallInstr);
    if (instr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, instr->GetBailOutInfo(), instr->GetBailOutKind(), instr);
    }

    // [stackAllocationPointer, ]scriptcontext, regexp, input[, limit] (to be pushed in reverse order)

    if(src1->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperString_Split)
    {
        //limit
        //As we are optimizing only for two operands, make limit UINT_MAX
        IR::Opnd* limit = IR::IntConstOpnd::New(UINT_MAX, TyUint32, instr->m_func);
        this->m_lowererMD.LoadHelperArgument(helperCallInstr, limit);
    }

    //input, regexp
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, argsOpnd[0]);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, argsOpnd[1]);

    // script context
    LoadScriptContext(helperCallInstr);

    IR::JnHelperMethod helperMethod = IR::JnHelperMethod::HelperInvalid;
    IR::AutoReuseOpnd autoReuseStackAllocationOpnd;
    if(callDst && instr->dstIsTempObject)
    {
        switch(src1->AsHelperCallOpnd()->m_fnHelper)
        {
            case IR::JnHelperMethod::HelperString_Split:
                helperMethod = IR::JnHelperMethod::HelperRegExp_SplitResultUsedAndMayBeTemp;
                break;

            case IR::JnHelperMethod::HelperString_Match:
                helperMethod = IR::JnHelperMethod::HelperRegExp_MatchResultUsedAndMayBeTemp;
                break;

            default:
                Assert(false);
                __assume(false);
        }

        // Allocate some space on the stack for the result array
        IR::RegOpnd *const stackAllocationOpnd = IR::RegOpnd::New(TyVar, m_func);
        autoReuseStackAllocationOpnd.Initialize(stackAllocationOpnd, m_func);
        stackAllocationOpnd->SetValueType(callDst->GetValueType());
        GenerateMarkTempAlloc(stackAllocationOpnd, Js::JavascriptArray::StackAllocationSize, helperCallInstr);
        m_lowererMD.LoadHelperArgument(helperCallInstr, stackAllocationOpnd);
    }
    else
    {
        switch(src1->AsHelperCallOpnd()->m_fnHelper)
        {
            case IR::JnHelperMethod::HelperString_Split:
                helperMethod =
                    callDst
                        ? IR::JnHelperMethod::HelperRegExp_SplitResultUsed
                        : IR::JnHelperMethod::HelperRegExp_SplitResultNotUsed;
                break;

            case IR::JnHelperMethod::HelperString_Match:
                helperMethod =
                    callDst
                        ? IR::JnHelperMethod::HelperRegExp_MatchResultUsed
                        : IR::JnHelperMethod::HelperRegExp_MatchResultNotUsed;
                break;

            default:
                Assert(false);
                __assume(false);
        }
    }

    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);
    instr->InsertBefore(labelHelper);
    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}